

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix_command.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  Option *this;
  reference piVar3;
  ostream *poVar4;
  reference pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *com;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  iterator iStack_480;
  int v;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  more_comms;
  ParseError *e;
  string local_438;
  allocator local_411;
  string local_410;
  undefined1 local_3f0 [8];
  vector<int,_std::allocator<int>_> vals;
  string local_3d0;
  allocator local_399;
  string local_398;
  undefined1 local_378 [8];
  App app;
  char **argv_local;
  int argc_local;
  
  app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"Prefix command app",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3d0,"",
             (allocator *)
             ((long)&vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  CLI::App::App((App *)local_378,&local_398,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  CLI::App::prefix_command((App *)local_378,true);
  CLI::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_3f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_410,"--vals,-v",&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_438,"",(allocator *)((long)&e + 7));
  this = CLI::App::
         add_option<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_(CLI::detail::enabler)0>
                   ((App *)local_378,&local_410,(vector<int,_std::allocator<int>_> *)local_3f0,
                    &local_438);
  CLI::Option::expected(this,-1);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  CLI::App::parse((App *)local_378,argc,
                  (char **)app.config_formatter_.
                           super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
  CLI::App::remaining_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,(App *)local_378,false);
  std::operator<<((ostream *)&std::cout,"Prefix");
  __end1 = CLI::std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_3f0);
  iStack_480 = CLI::std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_3f0);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffb80);
    if (!bVar2) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    iVar1 = *piVar3;
    poVar4 = std::operator<<((ostream *)&std::cout,": ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    std::operator<<(poVar4," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,'\n');
  std::operator<<(poVar4,"Remaining commands: ");
  __end1_1 = CLI::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
  com = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&com);
    if (!bVar2) break;
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_1);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)pbVar5);
    std::operator<<(poVar4," ");
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  more_comms.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  CLI::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)local_3f0);
  CLI::App::~App((App *)local_378);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("Prefix command app");
    app.prefix_command();

    std::vector<int> vals;
    app.add_option("--vals,-v", vals)->expected(-1);

    CLI11_PARSE(app, argc, argv);

    std::vector<std::string> more_comms = app.remaining();

    std::cout << "Prefix";
    for(int v : vals)
        std::cout << ": " << v << " ";

    std::cout << '\n' << "Remaining commands: ";

    for(const auto &com : more_comms)
        std::cout << com << " ";
    std::cout << '\n';

    return 0;
}